

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O2

void __thiscall
pybind11::enum_<ImPlotMarker_>::enum_<char[23]>
          (enum_<ImPlotMarker_> *this,handle *scope,char *name,char (*extra) [23])

{
  PyObject *pPVar1;
  is_new_style_constructor local_62;
  type local_61;
  cpp_function local_60;
  accessor<pybind11::detail::accessor_policies::str_attr> local_58;
  arg local_38;
  is_method local_28;
  name local_20;
  
  class_<ImPlotMarker_>::class_<char[23]>
            (&this->super_class_<ImPlotMarker_>,(handle)scope->m_ptr,name,extra);
  pPVar1 = scope->m_ptr;
  (this->m_base).m_base.m_ptr =
       (this->super_class_<ImPlotMarker_>).super_generic_type.super_object.super_handle.m_ptr;
  (this->m_base).m_parent.m_ptr = pPVar1;
  detail::enum_base::init(&this->m_base,(EVP_PKEY_CTX *)0x0);
  local_58._0_8_ = "value";
  local_58.obj.m_ptr._0_1_ = 2;
  detail::initimpl::
  factory<pybind11::enum_<ImPlotMarker_>::enum_<char[23]>(pybind11::handle_const&,char_const*,char_const(&)[23])::{lambda(int)#1},pybind11::detail::void_type(*)(),ImPlotMarker_(int),pybind11::detail::void_type()>
  ::execute<pybind11::class_<ImPlotMarker_>,pybind11::arg>
            ((factory<pybind11::enum_<ImPlotMarker_>::enum_<char[23]>(pybind11::handle_const&,char_const*,char_const(&)[23])::_lambda(int)_1_,pybind11::detail::void_type(*)(),ImPlotMarker_(int),pybind11::detail::void_type()>
              *)&local_38,&this->super_class_<ImPlotMarker_>,(arg *)&local_58);
  class_<ImPlotMarker_>::
  def<pybind11::enum_<ImPlotMarker_>::enum_<char[23]>(pybind11::handle_const&,char_const*,char_const(&)[23])::_lambda(ImPlotMarker_)_1_>
            (&this->super_class_<ImPlotMarker_>,"__int__",(type *)&local_58);
  class_<ImPlotMarker_>::
  def<pybind11::enum_<ImPlotMarker_>::enum_<char[23]>(pybind11::handle_const&,char_const*,char_const(&)[23])::_lambda(ImPlotMarker_)_2_>
            (&this->super_class_<ImPlotMarker_>,"__index__",(type *)&local_58);
  local_20.value = "__setstate__";
  local_28.class_.m_ptr =
       (handle)(this->super_class_<ImPlotMarker_>).super_generic_type.super_object.super_handle.
               m_ptr;
  local_38.name = "state";
  local_38._8_1_ = 2;
  cpp_function::
  cpp_function<pybind11::enum_<ImPlotMarker_>::enum_<char[23]>(pybind11::handle_const&,char_const*,char_const(&)[23])::_lambda(pybind11::detail::value_and_holder&,int)_1_,pybind11::detail::is_new_style_constructor,pybind11::name,pybind11::is_method,pybind11::arg,void>
            (&local_60,&local_61,&local_62,&local_20,&local_28,&local_38);
  local_58.obj.m_ptr =
       (this->super_class_<ImPlotMarker_>).super_generic_type.super_object.super_handle.m_ptr;
  local_58.key = "__setstate__";
  local_58.cache.super_handle.m_ptr = (handle)(PyObject *)0x0;
  detail::accessor<pybind11::detail::accessor_policies::str_attr>::operator=(&local_58,&local_60);
  object::~object(&local_58.cache);
  object::~object((object *)&local_60);
  return;
}

Assistant:

enum_(const handle &scope, const char *name, const Extra&... extra)
      : class_<Type>(scope, name, extra...), m_base(*this, scope) {
        constexpr bool is_arithmetic = detail::any_of<std::is_same<arithmetic, Extra>...>::value;
        constexpr bool is_convertible = std::is_convertible<Type, Scalar>::value;
        m_base.init(is_arithmetic, is_convertible);

        def(init([](Scalar i) { return static_cast<Type>(i); }), arg("value"));
        def("__int__", [](Type value) { return (Scalar) value; });
        #if PY_MAJOR_VERSION < 3
            def("__long__", [](Type value) { return (Scalar) value; });
        #endif
        #if PY_MAJOR_VERSION > 3 || (PY_MAJOR_VERSION == 3 && PY_MINOR_VERSION >= 8)
            def("__index__", [](Type value) { return (Scalar) value; });
        #endif

        attr("__setstate__") = cpp_function(
            [](detail::value_and_holder &v_h, Scalar arg) {
                detail::initimpl::setstate<Base>(v_h, static_cast<Type>(arg),
                        Py_TYPE(v_h.inst) != v_h.type->type); },
            detail::is_new_style_constructor(),
            pybind11::name("__setstate__"), is_method(*this), arg("state"));
    }